

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_flac_read_pcm_frames
                    (ma_flac *pFlac,void *pFramesOut,ma_uint64 frameCount,ma_uint64 *pFramesRead)

{
  ma_data_source_vtable *pmVar1;
  ma_flac *in_RCX;
  long in_RDX;
  long in_RDI;
  float *unaff_retaddr;
  ma_uint64 in_stack_00000008;
  ma_format format;
  ma_uint64 totalFramesRead;
  ma_result result;
  ma_channel *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  if (in_RCX != (ma_flac *)0x0) {
    (in_RCX->ds).vtable = (ma_data_source_vtable *)0x0;
  }
  if (in_RDX == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = MA_SUCCESS;
    ma_flac_get_data_format
              (in_RCX,(ma_format *)(ulong)in_stack_ffffffffffffffd0,(ma_uint32 *)0x0,
               (ma_uint32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,0x237a14);
    switch(in_stack_ffffffffffffffc4) {
    case 0:
    case 1:
    case 3:
      return MA_INVALID_OPERATION;
    case 2:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_flac_read_pcm_frames_s16
                         ((ma_dr_flac *)totalFramesRead,in_stack_00000008,(ma_int16 *)unaff_retaddr)
      ;
      break;
    case 4:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_flac_read_pcm_frames_s32
                         ((ma_dr_flac *)totalFramesRead,in_stack_00000008,(ma_int32 *)unaff_retaddr)
      ;
      break;
    case 5:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_flac_read_pcm_frames_f32
                         ((ma_dr_flac *)totalFramesRead,in_stack_00000008,unaff_retaddr);
      break;
    default:
      return MA_INVALID_OPERATION;
    }
    if (pmVar1 == (ma_data_source_vtable *)0x0) {
      local_4 = MA_AT_END;
    }
    if (in_RCX != (ma_flac *)0x0) {
      (in_RCX->ds).vtable = pmVar1;
    }
    if ((local_4 == MA_SUCCESS) && (pmVar1 == (ma_data_source_vtable *)0x0)) {
      local_4 = MA_AT_END;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_flac_read_pcm_frames(ma_flac* pFlac, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;

        ma_flac_get_data_format(pFlac, &format, NULL, NULL, NULL, 0);

        switch (format)
        {
            case ma_format_f32:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_f32(pFlac->dr, frameCount, (float*)pFramesOut);
            } break;

            case ma_format_s16:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_s16(pFlac->dr, frameCount, (ma_int16*)pFramesOut);
            } break;

            case ma_format_s32:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_s32(pFlac->dr, frameCount, (ma_int32*)pFramesOut);
            } break;

            case ma_format_u8:
            case ma_format_s24:
            case ma_format_unknown:
            default:
            {
                return MA_INVALID_OPERATION;
            };
        }

        /* In the future we'll update ma_dr_flac to return MA_AT_END for us. */
        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}